

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::translateArguments
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *arguments,
          CoherentFlags *lvalueCoherentFlags)

{
  Builder *this_00;
  TOperator TVar1;
  ulong uVar2;
  Id id;
  CoherentFlags *coherentFlags;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Decoration decoration;
  CoherentFlags CVar6;
  undefined4 extraout_var;
  long *plVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  TType *pTVar12;
  TGlslangToSpvTraverser *this_01;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  Id lvalue_id;
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  AccessChain *local_a0;
  TIntermAggregate *local_98;
  CoherentFlags *local_90;
  AccessChain local_88;
  long lVar7;
  
  local_90 = lvalueCoherentFlags;
  iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(node);
  lVar7 = CONCAT44(extraout_var,iVar4);
  TVar1 = (node->super_TIntermOperator).op;
  bVar15 = false;
  bVar16 = false;
  uVar13 = 0;
  if (TVar1 - EOpTextureQuerySize < 0x3c || TVar1 - EOpImageQuerySize < 0x15) {
    plVar8 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar7 + 8) + 0x18))();
    plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
    puVar9 = (uint *)(**(code **)(*plVar8 + 0x40))(plVar8);
    uVar13 = *puVar9;
    bVar15 = (uVar13 & 0x3ff00) == 0x30400;
    if ((uVar13 >> 0x11 & 1) == 0) {
      bVar16 = false;
    }
    else {
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
      plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
      iVar4 = (**(code **)(*plVar8 + 0x38))(plVar8);
      bVar16 = iVar4 == 3;
    }
  }
  local_b0 = (ulong)((uVar13 >> 0x11 & 1) == 0);
  local_b8 = (ulong)((uVar13 >> 0x12 & 1) != 0) + 2;
  if (bVar16) {
    local_e0 = 3;
    local_c8 = 5;
    local_d8 = 7;
    local_d0 = 6;
    local_f0 = 4;
  }
  else {
    local_e0 = 2;
    local_d8 = 6;
    local_d0 = 5;
    local_f0 = 3;
    local_c8 = 4;
  }
  this_00 = &this->builder;
  local_a8 = 4 - local_b0;
  local_b0 = local_b0 ^ 3;
  local_a0 = &(this->builder).accessChain;
  local_c0 = -4;
  uVar14 = 0;
  local_e8 = lVar7;
  local_98 = node;
LAB_0034dcaf:
  if ((long)(int)((ulong)(*(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8)) >> 3) <= (long)uVar14) {
    return;
  }
  spv::Builder::clearAccessChain(this_00);
  plVar8 = *(long **)(*(long *)(lVar7 + 8) + uVar14 * 8);
  (**(code **)(*plVar8 + 0x10))(plVar8,this);
  TVar1 = (node->super_TIntermOperator).op;
  iVar4 = (int)uVar14;
  switch(TVar1) {
  case EOpImageAtomicAdd:
  case EOpImageAtomicMin:
  case EOpImageAtomicMax:
  case EOpImageAtomicAnd:
  case EOpImageAtomicOr:
  case EOpImageAtomicXor:
  case EOpImageAtomicExchange:
  case EOpImageAtomicCompSwap:
  case EOpImageAtomicLoad:
  case EOpImageAtomicStore:
    if (uVar14 == 0) goto LAB_0034df37;
    goto LAB_0034de59;
  case EOpSubpassLoad:
  case EOpSubpassLoadMS:
  case EOpColorAttachmentReadEXT:
  case EOpImageGuardEnd:
  case EOpTextureGuardBegin:
  case EOpTextureQuerySize:
  case EOpTextureQueryLod:
  case EOpTextureQueryLevels:
  case EOpTextureQuerySamples:
  case EOpSamplingGuardBegin:
  case EOpTexture:
  case EOpTextureProj:
  case EOpTextureLod:
  case EOpTextureOffset:
  case EOpTextureFetch:
  case EOpTextureFetchOffset:
  case EOpTextureProjOffset:
  case EOpTextureLodOffset:
  case EOpTextureProjLod:
  case EOpTextureProjLodOffset:
  case EOpTextureGrad:
  case EOpTextureGradOffset:
  case EOpTextureProjGrad:
  case EOpTextureProjGradOffset:
  case EOpTextureGather:
  case EOpTextureGatherOffset:
  case EOpTextureGatherOffsets:
  case EOpTextureClamp:
  case EOpTextureOffsetClamp:
  case EOpTextureGradClamp:
  case EOpTextureGradOffsetClamp:
  case EOpTextureGatherLod:
  case EOpTextureGatherLodOffset:
  case EOpTextureGatherLodOffsets:
  case EOpFragmentMaskFetch:
  case EOpFragmentFetch:
  case EOpSparseTextureGuardBegin:
  case EOpSparseTexelsResident:
  case EOpSparseTextureGuardEnd:
  case EOpImageFootprintGuardBegin:
    goto switchD_0034dcfe_caseD_200;
  case EOpSparseImageLoad:
    uVar2 = local_b8;
    break;
  case EOpSparseImageLoadLod:
  case EOpSparseTextureGatherLod:
switchD_0034dcfe_caseD_203:
    if (iVar4 != 0) {
      if (iVar4 == 3) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  case EOpSparseTexture:
    uVar2 = local_e0;
    if (bVar15) goto switchD_0034dcfe_caseD_203;
    break;
  case EOpSparseTextureLod:
  case EOpSparseTextureOffset:
    goto switchD_0034dcfe_caseD_228;
  case EOpSparseTextureFetch:
    bVar16 = uVar14 == 3;
    bVar17 = uVar14 == 2;
    goto LAB_0034de16;
  case EOpSparseTextureFetchOffset:
    bVar16 = uVar14 == 4;
    bVar17 = uVar14 == 3;
LAB_0034de16:
    bVar3 = (uVar13 >> 8 & 0xff) == 5;
    if ((!(bool)(!bVar3 & bVar16)) && (!(bool)(bVar3 & bVar17))) goto switchD_0034dcfe_caseD_200;
    goto LAB_0034df37;
  case EOpSparseTextureLodOffset:
  case EOpSparseTextureGrad:
  case EOpSparseTextureOffsetClamp:
    uVar2 = local_c8;
    break;
  case EOpSparseTextureGradOffset:
  case EOpSparseTextureGradClamp:
    uVar2 = local_d0;
    break;
  case EOpSparseTextureGather:
    uVar2 = local_b0;
    break;
  case EOpSparseTextureGatherOffset:
  case EOpSparseTextureGatherOffsets:
    uVar2 = local_a8;
    break;
  case EOpSparseTextureClamp:
    if (bVar15) goto switchD_0034dcfe_caseD_238;
    goto switchD_0034dcfe_caseD_228;
  case EOpSparseTextureGradOffsetClamp:
    uVar2 = local_d8;
    break;
  case EOpSparseTextureGatherLodOffset:
  case EOpSparseTextureGatherLodOffsets:
  case EOpImageSampleFootprintNV:
switchD_0034dcfe_caseD_238:
    if (iVar4 != 0) {
      if (iVar4 == 4) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  case EOpImageSampleFootprintClampNV:
  case EOpImageSampleFootprintLodNV:
    if (iVar4 != 0) {
      if (iVar4 == 5) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  case EOpImageSampleFootprintGradNV:
    if (iVar4 != 0) {
      if (iVar4 == 6) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  case EOpImageSampleFootprintGradClampNV:
    if (iVar4 != 0) {
      if (iVar4 == 7) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  default:
    uVar5 = TVar1 - EOpRayQueryGetIntersectionTriangleVertexPositionsEXT;
    if ((0x11 < uVar5) || ((0x30001U >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_0034dcfe_caseD_200;
    if (iVar4 != 0) {
      if (iVar4 == 2) goto LAB_0034df37;
      goto LAB_0034de59;
    }
    goto LAB_0034deeb;
  }
joined_r0x0034ddf8:
  if (uVar2 == uVar14) {
LAB_0034df37:
    lvalue_id = spv::Builder::accessChainGetLValue(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(arguments,&lvalue_id);
    spv::Builder::AccessChain::AccessChain(&local_88,local_a0);
    coherentFlags = local_90;
    *(undefined2 *)local_90 = local_88.coherentFlags._0_2_;
    spv::Builder::AccessChain::~AccessChain(&local_88);
    id = lvalue_id;
    decoration = TranslateNonUniformDecoration(this,coherentFlags);
    lVar7 = local_e8;
    pTVar12 = (TType *)(ulong)id;
    spv::Builder::addDecoration(this_00,id,decoration,-1);
    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x18))();
    this_01 = (TGlslangToSpvTraverser *)(**(code **)(*plVar8 + 0xf0))(plVar8);
    CVar6 = TranslateCoherent(this_01,pTVar12);
    node = local_98;
    local_88.base = CONCAT22(local_88.base._2_2_,CVar6._0_2_);
    spv::Builder::AccessChain::CoherentFlags::operator|=(coherentFlags,(CoherentFlags *)&local_88);
  }
  else {
switchD_0034dcfe_caseD_200:
    if (uVar14 != 0) {
LAB_0034de59:
      lVar10 = (**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x60))();
      if ((lVar10 != 0) &&
         (lVar10 = (**(code **)(**(long **)(*(long *)(lVar7 + 8) + -8 + uVar14 * 8) + 0x60))(),
         lVar10 != 0)) {
        plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x60))();
        lVar10 = (**(code **)(*plVar8 + 0x180))(plVar8);
        plVar8 = (long *)(**(code **)(**(long **)(*(long *)(local_e8 + 8) + -8 + uVar14 * 8) + 0x60)
                         )();
        lVar11 = (**(code **)(*plVar8 + 0x180))(plVar8);
        lVar7 = local_e8;
        if (lVar10 == lVar11) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (arguments,
                     (value_type_conflict *)
                     ((long)(arguments->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + local_c0));
          goto LAB_0034dfe9;
        }
      }
    }
LAB_0034deeb:
    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x18))();
    pTVar12 = (TType *)(**(code **)(*plVar8 + 0xf0))(plVar8);
    local_88.base = accessChainLoad(this,pTVar12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (arguments,&local_88.base);
  }
LAB_0034dfe9:
  uVar14 = uVar14 + 1;
  local_c0 = local_c0 + 4;
  goto LAB_0034dcaf;
switchD_0034dcfe_caseD_228:
  uVar2 = local_f0;
  goto joined_r0x0034ddf8;
}

Assistant:

void TGlslangToSpvTraverser::translateArguments(const glslang::TIntermAggregate& node, std::vector<spv::Id>& arguments,
    spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags)
{
    const glslang::TIntermSequence& glslangArguments = node.getSequence();

    glslang::TSampler sampler = {};
    bool cubeCompare = false;
    bool f16ShadowCompare = false;
    if (node.isTexture() || node.isImage()) {
        sampler = glslangArguments[0]->getAsTyped()->getType().getSampler();
        cubeCompare = sampler.dim == glslang::EsdCube && sampler.arrayed && sampler.shadow;
        f16ShadowCompare = sampler.shadow &&
            glslangArguments[1]->getAsTyped()->getType().getBasicType() == glslang::EbtFloat16;
    }

    for (int i = 0; i < (int)glslangArguments.size(); ++i) {
        builder.clearAccessChain();
        glslangArguments[i]->traverse(this);

        // Special case l-value operands
        bool lvalue = false;
        switch (node.getOp()) {
        case glslang::EOpImageAtomicAdd:
        case glslang::EOpImageAtomicMin:
        case glslang::EOpImageAtomicMax:
        case glslang::EOpImageAtomicAnd:
        case glslang::EOpImageAtomicOr:
        case glslang::EOpImageAtomicXor:
        case glslang::EOpImageAtomicExchange:
        case glslang::EOpImageAtomicCompSwap:
        case glslang::EOpImageAtomicLoad:
        case glslang::EOpImageAtomicStore:
            if (i == 0)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoad:
            if ((sampler.ms && i == 3) || (! sampler.ms && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTexture:
            if (((cubeCompare || f16ShadowCompare) && i == 3) || (! (cubeCompare || f16ShadowCompare) && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureClamp:
            if (((cubeCompare || f16ShadowCompare) && i == 4) || (! (cubeCompare || f16ShadowCompare) && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLod:
        case glslang::EOpSparseTextureOffset:
            if  ((f16ShadowCompare && i == 4) || (! f16ShadowCompare && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetch:
            if ((sampler.dim != glslang::EsdRect && i == 3) || (sampler.dim == glslang::EsdRect && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetchOffset:
            if ((sampler.dim != glslang::EsdRect && i == 4) || (sampler.dim == glslang::EsdRect && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLodOffset:
        case glslang::EOpSparseTextureGrad:
        case glslang::EOpSparseTextureOffsetClamp:
            if ((f16ShadowCompare && i == 5) || (! f16ShadowCompare && i == 4))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffset:
        case glslang::EOpSparseTextureGradClamp:
            if ((f16ShadowCompare && i == 6) || (! f16ShadowCompare && i == 5))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffsetClamp:
            if ((f16ShadowCompare && i == 7) || (! f16ShadowCompare && i == 6))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGather:
            if ((sampler.shadow && i == 3) || (! sampler.shadow && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherOffset:
        case glslang::EOpSparseTextureGatherOffsets:
            if ((sampler.shadow && i == 4) || (! sampler.shadow && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLodOffset:
        case glslang::EOpSparseTextureGatherLodOffsets:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoadLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintNV:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintClampNV:
        case glslang::EOpImageSampleFootprintLodNV:
            if (i == 5)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradNV:
            if (i == 6)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradClampNV:
            if (i == 7)
                lvalue = true;
            break;
        case glslang::EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
        case glslang::EOpRayQueryGetIntersectionLSSPositionsNV:
        case glslang::EOpRayQueryGetIntersectionLSSRadiiNV:
            if (i == 2)
                lvalue = true;
            break;
        default:
            break;
        }

        if (lvalue) {
            spv::Id lvalue_id = builder.accessChainGetLValue();
            arguments.push_back(lvalue_id);
            lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
            builder.addDecoration(lvalue_id, TranslateNonUniformDecoration(lvalueCoherentFlags));
            lvalueCoherentFlags |= TranslateCoherent(glslangArguments[i]->getAsTyped()->getType());
        } else {
            if (i > 0 &&
                glslangArguments[i]->getAsSymbolNode() && glslangArguments[i-1]->getAsSymbolNode() &&
                glslangArguments[i]->getAsSymbolNode()->getId() == glslangArguments[i-1]->getAsSymbolNode()->getId()) {
                // Reuse the id if possible
                arguments.push_back(arguments[i-1]);
            } else {
                arguments.push_back(accessChainLoad(glslangArguments[i]->getAsTyped()->getType()));
            }
        }
    }
}